

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O2

argParserAdvancedConfiguration * __thiscall
argvParser::addArg(argvParser *this,string *argvShort,string *argvLong,string *help,
                  _func_int_int_char_ptr_ptr *callBack)

{
  argParserAdvancedConfiguration *paVar1;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  function<int_(int,_char_**)> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/src/argvParser.cpp:72:47)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/src/argvParser.cpp:72:47)>
             ::_M_manager;
  local_b8._M_unused._0_8_ = (undefined8)callBack;
  std::__cxx11::string::string((string *)&local_38,(string *)argvShort);
  std::__cxx11::string::string((string *)&local_58,(string *)argvLong);
  std::__cxx11::string::string((string *)&local_78,(string *)help);
  std::function<int_(int,_char_**)>::function(&local_98,(function<int_(int,_char_**)> *)&local_b8);
  paVar1 = addArg(this,&local_38,&local_58,&local_78,&local_98);
  std::_Function_base::~_Function_base(&local_98.super__Function_base);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  return paVar1;
}

Assistant:

argParserAdvancedConfiguration * argvParser::addArg(string argvShort, string argvLong, string help, int (*callBack)(int, char **)) {
    function<int(int, char **)> tmpCallback = [callBack](int i, char **argv) { return callBack(i, argv); };
    return addArg(argvShort, argvLong, help, tmpCallback);
}